

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O1

void bench_verify(void *arg,int iters)

{
  byte *pbVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [16];
  int iVar24;
  uint uVar25;
  long lVar26;
  byte bVar27;
  int iVar28;
  undefined1 *puVar29;
  long *plVar30;
  long lVar31;
  byte bVar32;
  ulong uVar33;
  char cVar34;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  undefined1 auVar35 [16];
  char cVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  short sVar59;
  short sVar60;
  undefined1 auVar68 [16];
  short sVar69;
  short sVar70;
  undefined1 auVar75 [12];
  undefined1 auVar80 [16];
  undefined4 uVar82;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  undefined8 uStack_1a8;
  long lStack_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  long lStack_180;
  long lStack_178;
  long lStack_170;
  long lStack_168;
  undefined1 auStack_148 [64];
  ulong uStack_108;
  ulong uStack_100;
  ulong uStack_f8;
  void *pvStack_f0;
  undefined1 *puStack_e8;
  code *pcStack_e0;
  uint local_cc;
  long local_c8;
  long local_c0;
  long local_b8;
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  long lVar44;
  undefined4 uVar61;
  undefined6 uVar62;
  undefined8 uVar63;
  undefined1 auVar64 [12];
  undefined1 auVar65 [12];
  undefined1 auVar66 [14];
  undefined1 auVar67 [14];
  undefined4 uVar71;
  undefined6 uVar72;
  undefined8 uVar73;
  undefined1 auVar74 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [14];
  undefined1 auVar78 [14];
  undefined1 auVar79 [14];
  undefined1 auVar81 [16];
  undefined6 uVar83;
  undefined8 uVar84;
  undefined1 auVar85 [12];
  undefined1 auVar86 [14];
  undefined1 auVar89 [16];
  
  if (0 < iters) {
    local_c0 = (long)arg + 0x48;
    local_b8 = (long)arg + 0x98;
    local_c8 = (long)arg + 8;
    uVar33 = 0;
    local_cc = iters;
    do {
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x47);
      *pbVar1 = *pbVar1 ^ (byte)uVar33;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x46);
      bVar32 = (byte)(uVar33 >> 8);
      *pbVar1 = *pbVar1 ^ bVar32;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x45);
      bVar27 = (byte)(uVar33 >> 0x10);
      *pbVar1 = *pbVar1 ^ bVar27;
      plVar30 = *arg;
      pcStack_e0 = (code *)0x103c66;
      puVar29 = local_70;
      iVar24 = secp256k1_ec_pubkey_parse
                         (plVar30,local_70,local_b8,*(undefined8 *)((long)arg + 0xc0));
      iVar28 = (int)puVar29;
      if (iVar24 != 1) {
        pcStack_e0 = (code *)0x103cef;
        bench_verify_cold_1();
LAB_00103cef:
        pcStack_e0 = (code *)0x103cf4;
        bench_verify_cold_2();
LAB_00103cf4:
        pcStack_e0 = bench_sign_run;
        bench_verify_cold_3();
        if (iVar28 < 1) {
          return;
        }
        uStack_108 = uVar33 >> 0x10;
        uStack_100 = uVar33 >> 8;
        uStack_f8 = uVar33;
        pvStack_f0 = arg;
        puStack_e8 = local_b0;
        pcStack_e0 = (code *)local_70;
        goto LAB_00103d25;
      }
      plVar30 = *arg;
      pcStack_e0 = (code *)0x103c82;
      puVar29 = local_b0;
      iVar24 = secp256k1_ecdsa_signature_parse_der
                         (plVar30,local_b0,local_c0,*(undefined8 *)((long)arg + 0x90));
      iVar28 = (int)puVar29;
      if (iVar24 != 1) goto LAB_00103cef;
      plVar30 = *arg;
      pcStack_e0 = (code *)0x103c9a;
      puVar29 = local_b0;
      uVar25 = secp256k1_ecdsa_verify(plVar30,local_b0,local_c8,local_70);
      iVar28 = (int)puVar29;
      if (uVar25 != ((int)uVar33 == 0)) goto LAB_00103cf4;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x47);
      *pbVar1 = *pbVar1 ^ (byte)uVar33;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x46);
      *pbVar1 = *pbVar1 ^ bVar32;
      pbVar1 = (byte *)((long)arg + *(long *)((long)arg + 0x90) + 0x45);
      *pbVar1 = *pbVar1 ^ bVar27;
      uVar25 = (int)uVar33 + 1;
      uVar33 = (ulong)uVar25;
    } while (local_cc != uVar25);
  }
  return;
LAB_00103d25:
  uStack_1a8 = 0x4a;
  lVar31 = *plVar30;
  iVar24 = secp256k1_ecdsa_sign(lVar31,auStack_148,plVar30 + 1,plVar30 + 5,0,0);
  if (iVar24 == 0) {
    bench_sign_run_cold_2();
LAB_00103da3:
    bench_sign_run_cold_1();
    auVar23 = _DAT_00105090;
    lVar26 = 0;
    auVar35 = _DAT_00105010;
    auVar52 = _DAT_00105020;
    auVar53 = _DAT_00105030;
    auVar54 = _DAT_00105040;
    auVar55 = _DAT_00105050;
    auVar56 = _DAT_00105060;
    auVar57 = _DAT_00105070;
    auVar58 = _DAT_00105080;
    do {
      auVar68 = auVar58 & auVar23;
      auVar80 = auVar57 & auVar23;
      sVar11 = auVar68._0_2_;
      cVar42 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[0] - (0xff < sVar11);
      sVar11 = auVar68._2_2_;
      sVar59 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar68[2] - (0xff < sVar11),cVar42);
      sVar11 = auVar68._4_2_;
      cVar34 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[4] - (0xff < sVar11);
      sVar11 = auVar68._6_2_;
      uVar61 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar68[6] - (0xff < sVar11),
                        CONCAT12(cVar34,sVar59));
      sVar11 = auVar68._8_2_;
      cVar36 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[8] - (0xff < sVar11);
      sVar11 = auVar68._10_2_;
      uVar62 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar68[10] - (0xff < sVar11),
                        CONCAT14(cVar36,uVar61));
      sVar11 = auVar68._12_2_;
      cVar37 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[0xc] - (0xff < sVar11);
      sVar11 = auVar68._14_2_;
      uVar63 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar68[0xe] - (0xff < sVar11),
                        CONCAT16(cVar37,uVar62));
      sVar11 = auVar80._0_2_;
      cVar38 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[0] - (0xff < sVar11);
      sVar11 = auVar80._2_2_;
      auVar64._0_10_ =
           CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar80[2] - (0xff < sVar11),
                    CONCAT18(cVar38,uVar63));
      sVar11 = auVar80._4_2_;
      cVar39 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[4] - (0xff < sVar11);
      auVar64[10] = cVar39;
      sVar11 = auVar80._6_2_;
      auVar64[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar80[6] - (0xff < sVar11);
      sVar11 = auVar80._8_2_;
      cVar40 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[8] - (0xff < sVar11);
      auVar66[0xc] = cVar40;
      auVar66._0_12_ = auVar64;
      sVar11 = auVar80._10_2_;
      auVar66[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar80[10] - (0xff < sVar11);
      sVar11 = auVar80._12_2_;
      cVar41 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[0xc] - (0xff < sVar11);
      auVar68[0xe] = cVar41;
      auVar68._0_14_ = auVar66;
      sVar11 = auVar80._14_2_;
      auVar68[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar80[0xe] - (0xff < sVar11);
      auVar80 = auVar56 & auVar23;
      auVar87 = auVar55 & auVar23;
      sVar11 = auVar80._0_2_;
      cVar51 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[0] - (0xff < sVar11);
      sVar11 = auVar80._2_2_;
      sVar69 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar80[2] - (0xff < sVar11),cVar51);
      sVar11 = auVar80._4_2_;
      cVar50 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[4] - (0xff < sVar11);
      sVar11 = auVar80._6_2_;
      uVar71 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar80[6] - (0xff < sVar11),
                        CONCAT12(cVar50,sVar69));
      sVar11 = auVar80._8_2_;
      cVar43 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[8] - (0xff < sVar11);
      sVar11 = auVar80._10_2_;
      uVar72 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar80[10] - (0xff < sVar11),
                        CONCAT14(cVar43,uVar71));
      sVar11 = auVar80._12_2_;
      cVar49 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[0xc] - (0xff < sVar11);
      sVar11 = auVar80._14_2_;
      uVar73 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar80[0xe] - (0xff < sVar11),
                        CONCAT16(cVar49,uVar72));
      sVar11 = auVar87._0_2_;
      cVar48 = (0 < sVar11) * (sVar11 < 0x100) * auVar87[0] - (0xff < sVar11);
      sVar11 = auVar87._2_2_;
      auVar74._0_10_ =
           CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar87[2] - (0xff < sVar11),
                    CONCAT18(cVar48,uVar73));
      sVar11 = auVar87._4_2_;
      cVar47 = (0 < sVar11) * (sVar11 < 0x100) * auVar87[4] - (0xff < sVar11);
      auVar74[10] = cVar47;
      sVar11 = auVar87._6_2_;
      auVar74[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar87[6] - (0xff < sVar11);
      sVar11 = auVar87._8_2_;
      cVar46 = (0 < sVar11) * (sVar11 < 0x100) * auVar87[8] - (0xff < sVar11);
      auVar77[0xc] = cVar46;
      auVar77._0_12_ = auVar74;
      sVar11 = auVar87._10_2_;
      auVar77[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar87[10] - (0xff < sVar11);
      sVar11 = auVar87._12_2_;
      cVar45 = (0 < sVar11) * (sVar11 < 0x100) * auVar87[0xc] - (0xff < sVar11);
      auVar88[0xe] = cVar45;
      auVar88._0_14_ = auVar77;
      sVar11 = auVar87._14_2_;
      auVar88[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar87[0xe] - (0xff < sVar11);
      cVar3 = (0 < sVar59) * (sVar59 < 0x100) * cVar42 - (0xff < sVar59);
      sVar11 = (short)((uint)uVar61 >> 0x10);
      sVar60 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar34 - (0xff < sVar11),cVar3);
      sVar11 = (short)((uint6)uVar62 >> 0x20);
      cVar42 = (0 < sVar11) * (sVar11 < 0x100) * cVar36 - (0xff < sVar11);
      sVar11 = (short)((ulong)uVar63 >> 0x30);
      uVar61 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar37 - (0xff < sVar11),
                        CONCAT12(cVar42,sVar60));
      sVar11 = (short)((unkuint10)auVar64._0_10_ >> 0x40);
      cVar34 = (0 < sVar11) * (sVar11 < 0x100) * cVar38 - (0xff < sVar11);
      sVar11 = auVar64._10_2_;
      uVar62 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar39 - (0xff < sVar11),
                        CONCAT14(cVar34,uVar61));
      sVar11 = auVar66._12_2_;
      cVar40 = (0 < sVar11) * (sVar11 < 0x100) * cVar40 - (0xff < sVar11);
      sVar11 = auVar68._14_2_;
      uVar63 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * cVar41 - (0xff < sVar11),
                        CONCAT16(cVar40,uVar62));
      cVar39 = (0 < sVar69) * (sVar69 < 0x100) * cVar51 - (0xff < sVar69);
      sVar11 = (short)((uint)uVar71 >> 0x10);
      auVar65._0_10_ =
           CONCAT19((0 < sVar11) * (sVar11 < 0x100) * cVar50 - (0xff < sVar11),
                    CONCAT18(cVar39,uVar63));
      sVar11 = (short)((uint6)uVar72 >> 0x20);
      cVar38 = (0 < sVar11) * (sVar11 < 0x100) * cVar43 - (0xff < sVar11);
      auVar65[10] = cVar38;
      sVar11 = (short)((ulong)uVar73 >> 0x30);
      auVar65[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar49 - (0xff < sVar11);
      sVar11 = (short)((unkuint10)auVar74._0_10_ >> 0x40);
      cVar37 = (0 < sVar11) * (sVar11 < 0x100) * cVar48 - (0xff < sVar11);
      auVar67[0xc] = cVar37;
      auVar67._0_12_ = auVar65;
      sVar11 = auVar74._10_2_;
      auVar67[0xd] = (0 < sVar11) * (sVar11 < 0x100) * cVar47 - (0xff < sVar11);
      sVar11 = auVar77._12_2_;
      cVar36 = (0 < sVar11) * (sVar11 < 0x100) * cVar46 - (0xff < sVar11);
      auVar80[0xe] = cVar36;
      auVar80._0_14_ = auVar67;
      sVar11 = auVar88._14_2_;
      auVar80[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar45 - (0xff < sVar11);
      auVar68 = auVar54 & auVar23;
      auVar88 = auVar53 & auVar23;
      sVar11 = auVar68._0_2_;
      cVar41 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[0] - (0xff < sVar11);
      sVar11 = auVar68._2_2_;
      sVar59 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar68[2] - (0xff < sVar11),cVar41);
      sVar11 = auVar68._4_2_;
      cVar43 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[4] - (0xff < sVar11);
      sVar11 = auVar68._6_2_;
      uVar71 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar68[6] - (0xff < sVar11),
                        CONCAT12(cVar43,sVar59));
      sVar11 = auVar68._8_2_;
      cVar45 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[8] - (0xff < sVar11);
      sVar11 = auVar68._10_2_;
      uVar72 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar68[10] - (0xff < sVar11),
                        CONCAT14(cVar45,uVar71));
      sVar11 = auVar68._12_2_;
      cVar46 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[0xc] - (0xff < sVar11);
      sVar11 = auVar68._14_2_;
      uVar73 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar68[0xe] - (0xff < sVar11),
                        CONCAT16(cVar46,uVar72));
      sVar11 = auVar88._0_2_;
      cVar47 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] - (0xff < sVar11);
      sVar11 = auVar88._2_2_;
      auVar75._0_10_ =
           CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar88[2] - (0xff < sVar11),
                    CONCAT18(cVar47,uVar73));
      sVar11 = auVar88._4_2_;
      cVar48 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[4] - (0xff < sVar11);
      auVar75[10] = cVar48;
      sVar11 = auVar88._6_2_;
      auVar75[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[6] - (0xff < sVar11);
      sVar11 = auVar88._8_2_;
      cVar49 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[8] - (0xff < sVar11);
      auVar78[0xc] = cVar49;
      auVar78._0_12_ = auVar75;
      sVar11 = auVar88._10_2_;
      auVar78[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[10] - (0xff < sVar11);
      sVar11 = auVar88._12_2_;
      cVar50 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0xc] - (0xff < sVar11);
      auVar87[0xe] = cVar50;
      auVar87._0_14_ = auVar78;
      sVar11 = auVar88._14_2_;
      auVar87[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0xe] - (0xff < sVar11);
      auVar68 = auVar52 & auVar23;
      auVar88 = auVar35 & auVar23;
      sVar11 = auVar68._0_2_;
      cVar51 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[0] - (0xff < sVar11);
      sVar11 = auVar68._2_2_;
      sVar69 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar68[2] - (0xff < sVar11),cVar51);
      sVar11 = auVar68._4_2_;
      cVar4 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[4] - (0xff < sVar11);
      sVar11 = auVar68._6_2_;
      uVar82 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar68[6] - (0xff < sVar11),
                        CONCAT12(cVar4,sVar69));
      sVar11 = auVar68._8_2_;
      cVar5 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[8] - (0xff < sVar11);
      sVar11 = auVar68._10_2_;
      uVar83 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar68[10] - (0xff < sVar11),
                        CONCAT14(cVar5,uVar82));
      sVar11 = auVar68._12_2_;
      cVar6 = (0 < sVar11) * (sVar11 < 0x100) * auVar68[0xc] - (0xff < sVar11);
      sVar11 = auVar68._14_2_;
      uVar84 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar68[0xe] - (0xff < sVar11),
                        CONCAT16(cVar6,uVar83));
      sVar11 = auVar88._0_2_;
      cVar7 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0] - (0xff < sVar11);
      sVar11 = auVar88._2_2_;
      auVar85._0_10_ =
           CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar88[2] - (0xff < sVar11),
                    CONCAT18(cVar7,uVar84));
      sVar11 = auVar88._4_2_;
      cVar8 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[4] - (0xff < sVar11);
      auVar85[10] = cVar8;
      sVar11 = auVar88._6_2_;
      auVar85[0xb] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[6] - (0xff < sVar11);
      sVar11 = auVar88._8_2_;
      cVar9 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[8] - (0xff < sVar11);
      auVar86[0xc] = cVar9;
      auVar86._0_12_ = auVar85;
      sVar11 = auVar88._10_2_;
      auVar86[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[10] - (0xff < sVar11);
      sVar11 = auVar88._12_2_;
      cVar10 = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0xc] - (0xff < sVar11);
      auVar89[0xe] = cVar10;
      auVar89._0_14_ = auVar86;
      sVar11 = auVar88._14_2_;
      auVar89[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar88[0xe] - (0xff < sVar11);
      cVar41 = (0 < sVar59) * (sVar59 < 0x100) * cVar41 - (0xff < sVar59);
      sVar11 = (short)((uint)uVar71 >> 0x10);
      sVar70 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar43 - (0xff < sVar11),cVar41);
      sVar11 = (short)((uint6)uVar72 >> 0x20);
      cVar43 = (0 < sVar11) * (sVar11 < 0x100) * cVar45 - (0xff < sVar11);
      sVar11 = (short)((ulong)uVar73 >> 0x30);
      uVar71 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar46 - (0xff < sVar11),
                        CONCAT12(cVar43,sVar70));
      sVar11 = (short)((unkuint10)auVar75._0_10_ >> 0x40);
      cVar45 = (0 < sVar11) * (sVar11 < 0x100) * cVar47 - (0xff < sVar11);
      sVar11 = auVar75._10_2_;
      uVar72 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * cVar48 - (0xff < sVar11),
                        CONCAT14(cVar45,uVar71));
      sVar11 = auVar78._12_2_;
      cVar46 = (0 < sVar11) * (sVar11 < 0x100) * cVar49 - (0xff < sVar11);
      sVar11 = auVar87._14_2_;
      uVar73 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * cVar50 - (0xff < sVar11),
                        CONCAT16(cVar46,uVar72));
      cVar47 = (0 < sVar69) * (sVar69 < 0x100) * cVar51 - (0xff < sVar69);
      sVar11 = (short)((uint)uVar82 >> 0x10);
      auVar76._0_10_ =
           CONCAT19((0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11),
                    CONCAT18(cVar47,uVar73));
      sVar11 = (short)((uint6)uVar83 >> 0x20);
      cVar48 = (0 < sVar11) * (sVar11 < 0x100) * cVar5 - (0xff < sVar11);
      auVar76[10] = cVar48;
      sVar11 = (short)((ulong)uVar84 >> 0x30);
      auVar76[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
      sVar11 = (short)((unkuint10)auVar85._0_10_ >> 0x40);
      cVar49 = (0 < sVar11) * (sVar11 < 0x100) * cVar7 - (0xff < sVar11);
      auVar79[0xc] = cVar49;
      auVar79._0_12_ = auVar76;
      sVar11 = auVar85._10_2_;
      auVar79[0xd] = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
      sVar11 = auVar86._12_2_;
      cVar50 = (0 < sVar11) * (sVar11 < 0x100) * cVar9 - (0xff < sVar11);
      auVar81[0xe] = cVar50;
      auVar81._0_14_ = auVar79;
      sVar11 = auVar89._14_2_;
      auVar81[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar10 - (0xff < sVar11);
      sVar11 = (short)((uint)uVar61 >> 0x10);
      sVar59 = (short)((uint6)uVar62 >> 0x20);
      sVar69 = (short)((ulong)uVar63 >> 0x30);
      sVar12 = (short)((unkuint10)auVar65._0_10_ >> 0x40);
      sVar13 = auVar65._10_2_;
      sVar14 = auVar67._12_2_;
      sVar15 = auVar80._14_2_;
      sVar16 = (short)((uint)uVar71 >> 0x10);
      sVar17 = (short)((uint6)uVar72 >> 0x20);
      sVar18 = (short)((ulong)uVar73 >> 0x30);
      sVar19 = (short)((unkuint10)auVar76._0_10_ >> 0x40);
      sVar20 = auVar76._10_2_;
      sVar21 = auVar79._12_2_;
      sVar22 = auVar81._14_2_;
      pcVar2 = (char *)(lVar31 + 8 + lVar26);
      *pcVar2 = ((0 < sVar60) * (sVar60 < 0x100) * cVar3 - (0xff < sVar60)) + '\x01';
      pcVar2[1] = ((0 < sVar11) * (sVar11 < 0x100) * cVar42 - (0xff < sVar11)) + '\x01';
      pcVar2[2] = ((0 < sVar59) * (sVar59 < 0x100) * cVar34 - (0xff < sVar59)) + '\x01';
      pcVar2[3] = ((0 < sVar69) * (sVar69 < 0x100) * cVar40 - (0xff < sVar69)) + '\x01';
      pcVar2[4] = ((0 < sVar12) * (sVar12 < 0x100) * cVar39 - (0xff < sVar12)) + '\x01';
      pcVar2[5] = ((0 < sVar13) * (sVar13 < 0x100) * cVar38 - (0xff < sVar13)) + '\x01';
      pcVar2[6] = ((0 < sVar14) * (sVar14 < 0x100) * cVar37 - (0xff < sVar14)) + '\x01';
      pcVar2[7] = ((0 < sVar15) * (sVar15 < 0x100) * cVar36 - (0xff < sVar15)) + '\x01';
      pcVar2[8] = ((0 < sVar70) * (sVar70 < 0x100) * cVar41 - (0xff < sVar70)) + '\x01';
      pcVar2[9] = ((0 < sVar16) * (sVar16 < 0x100) * cVar43 - (0xff < sVar16)) + '\x01';
      pcVar2[10] = ((0 < sVar17) * (sVar17 < 0x100) * cVar45 - (0xff < sVar17)) + '\x01';
      pcVar2[0xb] = ((0 < sVar18) * (sVar18 < 0x100) * cVar46 - (0xff < sVar18)) + '\x01';
      pcVar2[0xc] = ((0 < sVar19) * (sVar19 < 0x100) * cVar47 - (0xff < sVar19)) + '\x01';
      pcVar2[0xd] = ((0 < sVar20) * (sVar20 < 0x100) * cVar48 - (0xff < sVar20)) + '\x01';
      pcVar2[0xe] = ((0 < sVar21) * (sVar21 < 0x100) * cVar49 - (0xff < sVar21)) + '\x01';
      pcVar2[0xf] = ((0 < sVar22) * (sVar22 < 0x100) * cVar50 - (0xff < sVar22)) + '\x01';
      lVar26 = lVar26 + 0x10;
      lVar44 = auVar58._8_8_;
      auVar58._0_8_ = auVar58._0_8_ + 0x10;
      auVar58._8_8_ = lVar44 + 0x10;
      lVar44 = auVar57._8_8_;
      auVar57._0_8_ = auVar57._0_8_ + 0x10;
      auVar57._8_8_ = lVar44 + 0x10;
      lVar44 = auVar56._8_8_;
      auVar56._0_8_ = auVar56._0_8_ + 0x10;
      auVar56._8_8_ = lVar44 + 0x10;
      lVar44 = auVar55._8_8_;
      auVar55._0_8_ = auVar55._0_8_ + 0x10;
      auVar55._8_8_ = lVar44 + 0x10;
      lVar44 = auVar54._8_8_;
      auVar54._0_8_ = auVar54._0_8_ + 0x10;
      auVar54._8_8_ = lVar44 + 0x10;
      lVar44 = auVar53._8_8_;
      auVar53._0_8_ = auVar53._0_8_ + 0x10;
      auVar53._8_8_ = lVar44 + 0x10;
      lVar44 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + 0x10;
      auVar52._8_8_ = lVar44 + 0x10;
      lVar44 = auVar35._8_8_;
      auVar35._0_8_ = auVar35._0_8_ + 0x10;
      auVar35._8_8_ = lVar44 + 0x10;
    } while (lVar26 != 0x20);
    cVar34 = '\0';
    cVar36 = '\x01';
    cVar37 = '\x02';
    cVar38 = '\x03';
    cVar39 = '\x04';
    cVar40 = '\x05';
    cVar41 = '\x06';
    cVar42 = '\a';
    cVar43 = '\b';
    cVar45 = '\t';
    cVar46 = '\n';
    cVar47 = '\v';
    cVar48 = '\f';
    cVar49 = '\r';
    cVar50 = '\x0e';
    cVar51 = '\x0f';
    lVar26 = 0;
    do {
      pcVar2 = (char *)(lVar31 + 0x28 + lVar26);
      *pcVar2 = cVar34 + 'A';
      pcVar2[1] = cVar36 + 'A';
      pcVar2[2] = cVar37 + 'A';
      pcVar2[3] = cVar38 + 'A';
      pcVar2[4] = cVar39 + 'A';
      pcVar2[5] = cVar40 + 'A';
      pcVar2[6] = cVar41 + 'A';
      pcVar2[7] = cVar42 + 'A';
      pcVar2[8] = cVar43 + 'A';
      pcVar2[9] = cVar45 + 'A';
      pcVar2[10] = cVar46 + 'A';
      pcVar2[0xb] = cVar47 + 'A';
      pcVar2[0xc] = cVar48 + 'A';
      pcVar2[0xd] = cVar49 + 'A';
      pcVar2[0xe] = cVar50 + 'A';
      pcVar2[0xf] = cVar51 + 'A';
      lVar26 = lVar26 + 0x10;
      cVar34 = cVar34 + '\x10';
      cVar36 = cVar36 + '\x10';
      cVar37 = cVar37 + '\x10';
      cVar38 = cVar38 + '\x10';
      cVar39 = cVar39 + '\x10';
      cVar40 = cVar40 + '\x10';
      cVar41 = cVar41 + '\x10';
      cVar42 = cVar42 + '\x10';
      cVar43 = cVar43 + '\x10';
      cVar45 = cVar45 + '\x10';
      cVar46 = cVar46 + '\x10';
      cVar47 = cVar47 + '\x10';
      cVar48 = cVar48 + '\x10';
      cVar49 = cVar49 + '\x10';
      cVar50 = cVar50 + '\x10';
      cVar51 = cVar51 + '\x10';
    } while (lVar26 != 0x20);
    return;
  }
  lVar31 = *plVar30;
  iVar24 = secp256k1_ecdsa_signature_serialize_der(lVar31,&lStack_1a0,&uStack_1a8,auStack_148);
  if (iVar24 == 0) goto LAB_00103da3;
  plVar30[3] = lStack_190;
  plVar30[4] = lStack_188;
  plVar30[1] = lStack_1a0;
  plVar30[2] = lStack_198;
  plVar30[7] = lStack_170;
  plVar30[8] = lStack_168;
  plVar30[5] = lStack_180;
  plVar30[6] = lStack_178;
  iVar28 = iVar28 + -1;
  if (iVar28 == 0) {
    return;
  }
  goto LAB_00103d25;
}

Assistant:

static void bench_verify(void* arg, int iters) {
    int i;
    bench_data* data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_pubkey pubkey;
        secp256k1_ecdsa_signature sig;
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
        CHECK(secp256k1_ec_pubkey_parse(data->ctx, &pubkey, data->pubkey, data->pubkeylen) == 1);
        CHECK(secp256k1_ecdsa_signature_parse_der(data->ctx, &sig, data->sig, data->siglen) == 1);
        CHECK(secp256k1_ecdsa_verify(data->ctx, &sig, data->msg, &pubkey) == (i == 0));
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
    }
}